

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void create_file(char *filename,curl_off_t size)

{
  FILE *__stream;
  
  __stream = fopen(filename,"wb");
  if (__stream != (FILE *)0x0) {
    fseeko(__stream,size + -1,0);
    fputc(0,__stream);
    fclose(__stream);
    return;
  }
  fputs("create file error!",_stderr);
  exit(-1);
}

Assistant:

void create_file(const char *filename, curl_off_t size) {
    FILE *file = fopen(filename, "wb");
    if (file == nullptr) {
        fputs("create file error!", stderr);
        exit(-1);
    }
    fseeko(file, size - 1, SEEK_SET);
    fwrite("\0", 1, 1, file);
    fclose(file);
}